

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

type_conflict5
fmt::v5::fprintf<char[10],char[6]>
          (basic_ostream<char,_std::char_traits<char>_> *os,char (*format_str) [10],char (*args) [6]
          )

{
  int iVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_R8;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char[6]>
  as;
  char (*local_38 [3]) [6];
  basic_string_view<char> local_20;
  
  local_38[0] = args;
  local_20 = to_string_view<char>(*format_str);
  args_00.field_1.values_ = in_R8.values_;
  args_00.types_ = (unsigned_long_long)local_38;
  iVar1 = vfprintf<fmt::v5::basic_string_view<char>,char>
                    ((v5 *)os,(basic_ostream<char,_std::char_traits<char>_> *)&local_20,
                     format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char[6]>
                     ::TYPES,args_00);
  return iVar1;
}

Assistant:

fprintf(std::basic_ostream<FMT_CHAR(S)> &os,
            const S &format_str, const Args & ... args) {
  internal::check_format_string<Args...>(format_str);
  typedef internal::basic_buffer<FMT_CHAR(S)> buffer;
  typedef typename basic_printf_context_t<buffer>::type context;
  format_arg_store<context, Args...> as{ args... };
  return vfprintf(os, to_string_view(format_str),
                  basic_format_args<context>(as));
}